

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

int bcholu(double *A,int N)

{
  int iVar1;
  double *UT;
  double *UB;
  ulong uVar2;
  size_t __n;
  
  UT = (double *)malloc((long)N * (long)N * 8);
  UB = (double *)malloc(0x8000);
  iVar1 = rbcholu(A,N,N,UB,UT);
  if (0 < N) {
    __n = 0;
    uVar2 = 0;
    do {
      if (__n != 0) {
        memset(A + uVar2,0,__n);
      }
      uVar2 = (ulong)(uint)((int)uVar2 + N);
      __n = __n + 8;
    } while ((ulong)(uint)N << 3 != __n);
  }
  free(UB);
  free(UT);
  return iVar1;
}

Assistant:

int bcholu(double *A, int N) {
	int stride,i,j,t,b,sc;
	double *UB,*UT;
	b = (int) BLOCKSIZE;
	UT = (double*) malloc(sizeof(double) * N * N);
	UB = (double*) malloc(sizeof(double) * b * b);
	stride = N; 
	
	sc = rbcholu(A,N,stride,UB,UT);
	
	for(i=0; i < N;++i) {
		t = i *N;
		for(j=0;j < i;++j) {
			A[t+j] = 0.;
		}
	}

	free(UB);
	free(UT);
	
	return sc;
	
}